

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::
getConstraintsBounds
          (MultipleShootingTranscription *this,VectorDynSize *constraintsLowerBounds,
          VectorDynSize *constraintsUpperBounds)

{
  uint uVar1;
  ulong uVar2;
  VectorDynSize *in_RDX;
  VectorDynSize *in_RSI;
  long *in_RDI;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 0xb) & 1) == 0) {
    iDynTree::reportError
              ("MultipleShootingTranscription","getConstraintsInfo",
               "First you need to call the prepare method");
    local_1 = false;
  }
  else {
    uVar2 = iDynTree::VectorDynSize::size();
    uVar1 = (**(code **)(*in_RDI + 0x28))();
    if (uVar2 != uVar1) {
      (**(code **)(*in_RDI + 0x28))();
      iDynTree::VectorDynSize::resize((ulong)in_RSI);
    }
    uVar2 = iDynTree::VectorDynSize::size();
    uVar1 = (**(code **)(*in_RDI + 0x28))();
    if (uVar2 != uVar1) {
      (**(code **)(*in_RDI + 0x28))();
      iDynTree::VectorDynSize::resize((ulong)in_RDX);
    }
    iDynTree::VectorDynSize::operator=(in_RSI,(VectorDynSize *)(in_RDI + 0x54));
    iDynTree::VectorDynSize::operator=(in_RDX,(VectorDynSize *)(in_RDI + 0x58));
    local_1 = true;
  }
  return local_1;
}

Assistant:

virtual bool getConstraintsBounds(VectorDynSize& constraintsLowerBounds, VectorDynSize& constraintsUpperBounds) override {
                if (!(m_prepared)){
                    reportError("MultipleShootingTranscription", "getConstraintsInfo", "First you need to call the prepare method");
                    return false;
                }

                if (constraintsLowerBounds.size() != numberOfConstraints()) {
                    constraintsLowerBounds.resize(numberOfConstraints());
                }

                if (constraintsUpperBounds.size() != numberOfConstraints()) {
                    constraintsUpperBounds.resize(numberOfConstraints());
                }

                constraintsLowerBounds = m_constraintsLowerBound;
                constraintsUpperBounds = m_constraintsUpperBound;

                return true;
            }